

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O1

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::TPZDohrMatrix
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  TPZReference *pTVar1;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrMatrix_01a0fe60;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZDohrAssembly<double> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fAssembly).fRef = pTVar1;
  return;
}

Assistant:

TPZDohrMatrix() : TPZMatrix<TVar>()
    {
        
    }